

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O0

void lowbd_blend_a64_d16_mask_subw0_subh0_w32_avx2
               (uint8_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h,
               int w,__m256i *round_offset,int shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint in_ECX;
  long in_RDX;
  __m256i *unaff_RBP;
  void *in_RSI;
  undefined1 auVar3 [32];
  undefined1 auVar4 [64];
  CONV_BUF_TYPE *unaff_retaddr;
  CONV_BUF_TYPE *in_stack_00000008;
  __m256i m0;
  __m256i m;
  int j;
  int i;
  __m256i v_maxval;
  undefined4 in_stack_fffffffffffffe4c;
  int in_stack_fffffffffffffe50;
  undefined4 local_128;
  undefined4 local_124;
  undefined8 local_e0;
  __m256i *in_stack_ffffffffffffffe8;
  __m256i *in_stack_fffffffffffffff0;
  
  auVar1 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar1 = vpinsrw_avx(auVar1,0x40,2);
  auVar1 = vpinsrw_avx(auVar1,0x40,3);
  auVar1 = vpinsrw_avx(auVar1,0x40,4);
  auVar1 = vpinsrw_avx(auVar1,0x40,5);
  auVar1 = vpinsrw_avx(auVar1,0x40,6);
  auVar1 = vpinsrw_avx(auVar1,0x40,7);
  auVar2 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar2 = vpinsrw_avx(auVar2,0x40,2);
  auVar2 = vpinsrw_avx(auVar2,0x40,3);
  auVar2 = vpinsrw_avx(auVar2,0x40,4);
  auVar2 = vpinsrw_avx(auVar2,0x40,5);
  auVar2 = vpinsrw_avx(auVar2,0x40,6);
  auVar2 = vpinsrw_avx(auVar2,0x40,7);
  auVar4 = ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1,
                               ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2));
  local_e0 = in_RDX;
  for (local_124 = 0; local_124 < (int)mask_stride; local_124 = local_124 + 1) {
    for (local_128 = 0; auVar3 = auVar4._0_32_, local_128 < h; local_128 = local_128 + 0x20) {
      yy_loadu_256((__m256i *)((long)in_stack_00000008 + (long)local_128),in_RSI);
      vpmovzxbw_avx2(auVar3._0_16_);
      auVar3 = vpmovzxbw_avx2(auVar3._16_16_);
      in_RSI = (void *)(local_e0 + (long)local_128 * 2);
      auVar4 = ZEXT1664(auVar3._0_16_);
      blend_a64_d16_mask_w32_avx2
                (mask,in_stack_00000008,unaff_retaddr,unaff_RBP,in_stack_fffffffffffffff0,
                 in_stack_ffffffffffffffe8,
                 (__m256i *)CONCAT44(in_stack_fffffffffffffe4c,round_offset._0_4_),
                 in_stack_fffffffffffffe50);
    }
    in_stack_00000008 = (CONV_BUF_TYPE *)((long)in_stack_00000008 + ((ulong)mask & 0xffffffff));
    local_e0 = local_e0 + (ulong)in_ECX * 2;
  }
  return;
}

Assistant:

static inline void lowbd_blend_a64_d16_mask_subw0_subh0_w32_avx2(
    uint8_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h, int w,
    const __m256i *round_offset, int shift) {
  const __m256i v_maxval = _mm256_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);
  for (int i = 0; i < h; ++i) {
    for (int j = 0; j < w; j += 32) {
      const __m256i m = yy_loadu_256(mask + j);
      const __m256i m0 = _mm256_cvtepu8_epi16(_mm256_castsi256_si128(m));
      const __m256i m1 = _mm256_cvtepu8_epi16(_mm256_extracti128_si256(m, 1));

      blend_a64_d16_mask_w32_avx2(dst + j, src0 + j, src1 + j, &m0, &m1,
                                  round_offset, &v_maxval, shift);
    }
    mask += mask_stride;
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
  }
}